

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForX11Event(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  pollfd fd;
  
  fd.fd = *(int *)(_glfw.x11.display + 0x10);
  fd.events = 1;
  fd.revents = 0;
  do {
    iVar1 = XPending(_glfw.x11.display);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = waitForData(&fd,1,timeout);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForX11Event(double* timeout)
{
    struct pollfd fd = { ConnectionNumber(_glfw.x11.display), POLLIN };

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(&fd, 1, timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}